

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLineBspline.cpp
# Opt level: O3

void __thiscall
chrono::geometry::ChLineBspline::ChLineBspline
          (ChLineBspline *this,int morder,
          vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *mpoints,
          ChVectorDynamic<> *mknots)

{
  (this->super_ChLine).closed = false;
  (this->super_ChLine).complexityU = 2;
  (this->super_ChLine).super_ChGeometry._vptr_ChGeometry =
       (_func_int **)&PTR__ChLineBspline_00b3e0d8;
  this->closed = false;
  (this->points).
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->points).
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->points).
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  SetupData(this,morder,mpoints,mknots);
  return;
}

Assistant:

ChLineBspline::ChLineBspline(
    int morder,                         ///< order p: 1= linear, 2=quadratic, etc.
    const std::vector<ChVector<> >& mpoints,  ///< control points, size n. Required: at least n >= p+1
    ChVectorDynamic<>* mknots           ///< knots, size k. Required k=n+p+1. If not provided, initialized to uniform.
) {
	this->closed = false;
    this->SetupData(morder, mpoints, mknots);
}